

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Learn.cpp
# Opt level: O1

int __thiscall Qclass::Train(Qclass *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint lastAction;
  int iVar4;
  ostream *poVar5;
  int lastState;
  int j;
  long lVar6;
  int iVar7;
  int iVar8;
  double (*padVar9) [4];
  int i;
  int iVar10;
  long lVar11;
  int iVar12;
  int local_3c;
  int local_38;
  
  createGrid(this);
  iVar2 = rand();
  iVar2 = iVar2 % 0x32;
  iVar3 = rand();
  iVar3 = iVar3 % 0x32;
  iVar7 = this->goal_x * 0x32 + this->goal_y;
  if (this->grid[iVar2][iVar3] == 1) {
    iVar4 = this->grid[iVar2][iVar3];
    while (iVar4 == 1) {
      iVar2 = rand();
      iVar2 = iVar2 % 0x32;
      iVar3 = rand();
      iVar3 = iVar3 % 0x32;
      iVar4 = this->grid[iVar2][iVar3];
    }
  }
  iVar8 = iVar2 * 0x32 + iVar3;
  bVar1 = true;
  iVar4 = 0;
  local_3c = 0;
  local_38 = 0;
  do {
    if (iVar7 != 0) {
      lastAction = 0;
      lastState = 0;
      do {
        iVar10 = iVar2;
        iVar12 = iVar3;
        if (!bVar1) {
          if (lastAction == 0) {
            local_38 = iVar2 + 1;
          }
          iVar10 = iVar2 + -1;
          if (lastAction != 1) {
            iVar10 = local_38;
          }
          if (lastAction < 2) {
            local_3c = iVar3;
          }
          if (lastAction == 2) {
            local_3c = iVar3 + 1;
          }
          if ((lastAction & 0xfffffffe) == 2) {
            iVar10 = iVar2;
          }
          iVar12 = local_3c;
          if (lastAction == 3) {
            iVar12 = iVar3 + -1;
          }
          iVar8 = iVar10 * 0x32 + iVar12;
          Qupdate(this,lastAction,lastState,iVar2,iVar3,iVar8);
          local_3c = iVar12;
          local_38 = iVar10;
        }
        lastAction = detAction(this,iVar8);
        if (this->restart == true) {
          this->restart = false;
          iVar2 = rand();
          iVar2 = iVar2 % 0x32;
          iVar3 = rand();
          iVar3 = iVar3 % 0x32;
          if (this->grid[iVar2][iVar3] == 1) {
            iVar8 = this->grid[iVar2][iVar3];
            while (iVar8 == 1) {
              iVar2 = rand();
              iVar2 = iVar2 % 0x32;
              iVar3 = rand();
              iVar3 = iVar3 % 0x32;
              iVar8 = this->grid[iVar2][iVar3];
            }
          }
          iVar8 = iVar2 * 0x32 + iVar3;
          lastAction = detAction(this,iVar8);
          bVar1 = true;
        }
        else {
          bVar1 = false;
          iVar2 = iVar10;
          iVar3 = iVar12;
        }
        lastState = iVar8;
      } while (iVar8 != iVar7);
    }
    iVar4 = iVar4 + 1;
  } while (iVar4 != 50000);
  padVar9 = this->Q;
  lVar11 = 0;
  do {
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
    lVar6 = 0;
    do {
      poVar5 = std::ostream::_M_insert<double>((*padVar9)[lVar6]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    lVar11 = lVar11 + 1;
    padVar9 = padVar9 + 1;
  } while (lVar11 != 0x9c4);
  return 0;
}

Assistant:

int Qclass::Train() {
  Qclass::createGrid();
  int initialTrial = 1;
  int new_x = 0;
  int action = 0;
  int new_y = 0;
  int new_state = 0;
  int start_x = rand() % 50;
  int start_y = rand() % 50;
  int goal_state = findState(goal_x, goal_y);
  if (grid[start_x][start_y] == 1) {
    while (grid[start_x][start_y] == 1) {
      start_x = rand() % 50;
      start_y = rand() % 50;
    }
  }
  int prev_x = start_x;
  int prev_y = start_y;
  int state = findState(start_x, start_y);
  for (int k = 0; k < 50000; k++) {
    int lastState = 0;
    int lastAction = 0;
    while (lastState != goal_state) {
      // Skips this loop for first run as there are no previous nodes
      if (initialTrial == 0) {
        if (lastAction == 0) {
          new_x = prev_x + 1;
          new_y = prev_y;
        }
        if (lastAction == 1) {
          new_x = prev_x - 1;
          new_y = prev_y;
        }
        if (lastAction == 2) {
          new_x = prev_x;
          new_y = prev_y + 1;
        }
        if (lastAction == 3) {
          new_x = prev_x;
          new_y = prev_y - 1;
        }
        new_state = findState(new_x, new_y);
        Qupdate(lastAction, lastState, prev_x, prev_y, new_state);
        prev_x = new_x;
        prev_y = new_y;
        state = findState(prev_x, prev_y);
      }
      action = detAction(state);
      lastState = state;
      lastAction = action;
      initialTrial = 0;
      // Reinitialize all the training data whenever a collision occurs
      if (restart == true) {
        restart = false;
        initialTrial = 1;
        int start_x = rand() % 50;
        int start_y = rand() % 50;
        if (grid[start_x][start_y] == 1) {
          while (grid[start_x][start_y] == 1) {
            start_x = rand() % 50;
            start_y = rand() % 50;
          }
        }
        prev_x = start_x;
        prev_y = start_y;
        state = findState(start_x, start_y);
        action = detAction(state);
        lastState = state;
        lastAction = action;
      }
    }
  }
  // Outputting the Q table for 2500 states and 4 actions
  for (int i = 0; i < 2500; i++) {
    std::cout << i << "  ";
    for (int j = 0; j < 4; j++) {
      std::cout << Q[i][j] << "  ";
    }
    std::cout << std::endl;
  }
  return 0;
}